

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O0

T_INDEX __thiscall
Nova::Grid<float,_1>::Cell(Grid<float,_1> *this,TV *location,int number_of_ghost_cells)

{
  int in_ECX;
  undefined4 in_register_00000014;
  int number_of_ghost_cells_local;
  TV *location_local;
  Grid<float,_1> *this_local;
  T_INDEX *index;
  
  Vector<int,_1,_true>::Vector(&this->counts);
  Cell((Grid<float,_1> *)location,(TV *)CONCAT44(in_register_00000014,number_of_ghost_cells),
       &this->counts,in_ECX);
  return (T_INDEX)SUB84(this,0);
}

Assistant:

T_INDEX Cell(const TV& location,const int number_of_ghost_cells) const
    {
        T_INDEX index;
        Cell(location,index,number_of_ghost_cells);
        return index;
    }